

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateClientSession
          (anon_unknown_0 *this,SSL_CTX *client_ctx,SSL_CTX *server_ctx,ClientConfig *config)

{
  bool bVar1;
  long lVar2;
  anon_unknown_0 *paVar3;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  _Head_base<0UL,_ssl_st_*,_false> local_40;
  _Head_base<0UL,_ssl_st_*,_false> local_38;
  
  paVar3 = (anon_unknown_0 *)&(anonymous_namespace)::g_last_session;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,SaveLastSession);
  local_38._M_head_impl = (SSL *)0x0;
  local_40._M_head_impl = (SSL *)0x0;
  bVar1 = ConnectClientAndServer
                    ((UniquePtr<SSL> *)&local_38,(UniquePtr<SSL> *)&local_40,client_ctx,server_ctx,
                     config,true);
  if ((bVar1) &&
     (bVar1 = FlushNewSessionTickets(local_38._M_head_impl,local_40._M_head_impl), bVar1)) {
    SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,(new_session_cb *)0x0);
    lVar2 = (anonymous_namespace)::g_last_session;
    if ((anonymous_namespace)::g_last_session != 0) goto LAB_0017f187;
    _GLOBAL__N_1::CreateClientSession();
  }
  else {
    _GLOBAL__N_1::CreateClientSession();
  }
  lVar2 = 0;
  paVar3 = this;
LAB_0017f187:
  *(long *)this = lVar2;
  *(undefined8 *)paVar3 = 0;
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_40);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_38);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateClientSession(
    SSL_CTX *client_ctx, SSL_CTX *server_ctx,
    const ClientConfig &config = ClientConfig()) {
  g_last_session = nullptr;
  SSL_CTX_sess_set_new_cb(client_ctx, SaveLastSession);

  // Connect client and server to get a session.
  bssl::UniquePtr<SSL> client, server;
  if (!ConnectClientAndServer(&client, &server, client_ctx, server_ctx,
                              config) ||
      !FlushNewSessionTickets(client.get(), server.get())) {
    fprintf(stderr, "Failed to connect client and server.\n");
    return nullptr;
  }

  SSL_CTX_sess_set_new_cb(client_ctx, nullptr);

  if (!g_last_session) {
    fprintf(stderr, "Client did not receive a session.\n");
    return nullptr;
  }
  return std::move(g_last_session);
}